

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::destroy(Geometry *this)

{
  Geometry *this_local;
  
  this->refCount = this->refCount + -1;
  if (this->refCount < 1) {
    PluginList::destruct((PluginList *)&s_plglist,this);
    (*DAT_00168638)(this->triangles);
    (*DAT_00168638)(this->morphTargets);
    (*DAT_00168638)(this->meshHeader);
    MaterialList::deinit(&this->matList);
    (*DAT_00168638)(this);
    numAllocated = numAllocated + -1;
  }
  return;
}

Assistant:

void
Geometry::destroy(void)
{
	this->refCount--;
	if(this->refCount <= 0){
		s_plglist.destruct(this);
		// Also frees colors and tex coords
		rwFree(this->triangles);
		// Also frees their data
		rwFree(this->morphTargets);
		// Also frees indices
		rwFree(this->meshHeader);
		this->matList.deinit();
		rwFree(this);
		numAllocated--;
	}
}